

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O0

String * __thiscall
kj::anon_unknown_0::percentDecode
          (String *__return_storage_ptr__,anon_unknown_0 *this,ArrayPtr<const_char> text,
          bool *hadErrors,Options *options)

{
  ArrayPtr<const_char> text_00;
  EncodingResult<kj::String> *pEVar1;
  undefined1 local_50 [8];
  EncodingResult<kj::String> result;
  Options *options_local;
  bool *hadErrors_local;
  ArrayPtr<const_char> text_local;
  
  text_local.ptr = text.ptr;
  result._24_8_ = hadErrors;
  hadErrors_local = (bool *)this;
  text_local.size_ = (size_t)__return_storage_ptr__;
  if ((*hadErrors & 1U) == 0) {
    str<kj::ArrayPtr<char_const>&>
              (__return_storage_ptr__,(kj *)&hadErrors_local,(ArrayPtr<const_char> *)text_local.ptr)
    ;
  }
  else {
    text_00.size_ = (size_t)text_local.ptr;
    text_00.ptr = (char *)this;
    decodeUriComponent((EncodingResult<kj::String> *)local_50,text_00);
    if (((byte)result.super_String.content.disposer & 1) != 0) {
      *(undefined1 *)text.size_ = 1;
    }
    pEVar1 = mv<kj::EncodingResult<kj::String>>((EncodingResult<kj::String> *)local_50);
    String::String(__return_storage_ptr__,&pEVar1->super_String);
    EncodingResult<kj::String>::~EncodingResult((EncodingResult<kj::String> *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

String percentDecode(ArrayPtr<const char> text, bool& hadErrors, const Url::Options& options) {
  if (options.percentDecode) {
    auto result = decodeUriComponent(text);
    if (result.hadErrors) hadErrors = true;
    return kj::mv(result);
  }
  return kj::str(text);
}